

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

size_t ZSTD_decompressBlock_internal
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,int frame)

{
  byte bVar1;
  byte bVar2;
  BYTE BVar3;
  ulong uVar4;
  seq_t sequence;
  seq_t sequence_00;
  seq_t sequence_01;
  ZSTD_seqSymbol *pZVar5;
  ZSTD_DCtx *pZVar6;
  BIT_DStream_status BVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  BYTE *op_2;
  size_t sVar11;
  size_t sVar12;
  long lVar13;
  BYTE *pBVar14;
  BYTE *pBVar15;
  byte bVar16;
  BYTE *pBVar17;
  BYTE *pBVar18;
  int iVar19;
  ulong uVar20;
  BYTE *pBVar21;
  BYTE *pBVar22;
  ulong uVar23;
  size_t sVar24;
  BYTE *pBVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  BYTE *oend;
  void *srcBuffer;
  BYTE *pBVar29;
  BYTE *pBVar30;
  BYTE **ppBVar31;
  BYTE *ip_5;
  BYTE *pBVar32;
  size_t __n;
  ZSTD_longOffset_e in_stack_fffffffffffffde8;
  BYTE *local_1d8;
  BYTE *litPtr;
  BYTE *local_1c0;
  BYTE *local_1b8;
  BYTE *local_1b0;
  BYTE *local_1a8;
  BIT_DStream_t local_1a0;
  ZSTD_fseState local_178;
  ZSTD_fseState local_168;
  ZSTD_fseState local_158;
  BYTE *local_148 [7];
  ZSTD_DCtx *local_110;
  int nbSeq;
  BYTE *local_100;
  BYTE *local_f8;
  long *local_f0;
  BYTE *local_e8;
  BYTE *local_e0;
  int local_d4;
  BYTE *local_d0;
  ulong local_c8;
  size_t local_c0;
  seq_t sequences [4];
  
  if (0x1ffff < srcSize) {
    return 0xffffffffffffffb8;
  }
  sVar11 = ZSTD_decodeLiteralsBlock(dctx,src,srcSize);
  if (0xffffffffffffff88 < sVar11) {
    return sVar11;
  }
  local_110 = dctx;
  sVar12 = ZSTD_decodeSeqHeaders(dctx,&nbSeq,(void *)((long)src + sVar11),srcSize - sVar11);
  if (0xffffffffffffff88 < sVar12) {
    return sVar12;
  }
  srcBuffer = (void *)((long)((long)src + sVar11) + sVar12);
  sVar12 = (srcSize - sVar11) - sVar12;
  pBVar30 = (BYTE *)dst;
  if (frame == 0) {
    if (0 < nbSeq) goto LAB_0014afd3;
  }
  else if (0x1000000 < (local_110->fParams).windowSize && 0 < nbSeq) {
LAB_0014afd3:
    iVar19 = 0;
    for (uVar9 = 0; bVar16 = (byte)local_110->OFTptr->baseValue, uVar9 >> (bVar16 & 0x1f) == 0;
        uVar9 = uVar9 + 1) {
      iVar19 = (iVar19 + 1) - (uint)(local_110->OFTptr[(ulong)uVar9 + 1].nbAdditionalBits < 0x17);
    }
    if (6 < (uint)(iVar19 << (8 - bVar16 & 0x1f))) {
      if (local_110->bmi2 != 0) {
        sVar11 = ZSTD_decompressSequencesLong_bmi2
                           (local_110,dst,dstCapacity,srcBuffer,sVar12,nbSeq,
                            in_stack_fffffffffffffde8);
        return sVar11;
      }
      pBVar32 = (BYTE *)(dstCapacity + (long)dst);
      litPtr = local_110->litPtr;
      sVar11 = local_110->litSize;
      pBVar25 = litPtr + sVar11;
      if (nbSeq != 0) {
        local_1c0 = (BYTE *)local_110->base;
        local_f8 = (BYTE *)local_110->vBase;
        local_148[4] = (BYTE *)local_110->dictEnd;
        local_110->fseEntropy = 1;
        for (lVar13 = -6; lVar13 != 0; lVar13 = lVar13 + 2) {
          *(ulong *)((long)local_148 + lVar13 * 4 + 0x18) =
               (ulong)*(uint *)((long)&local_110->previousDstEnd + lVar13 * 2);
        }
        iVar19 = 4;
        if (nbSeq < 4) {
          iVar19 = nbSeq;
        }
        local_148[5] = (BYTE *)((long)dst - (long)local_1c0);
        local_1b0 = litPtr + sVar11;
        local_148[3] = local_1c0;
        local_100 = local_148[4];
        sVar11 = BIT_initDStream(&local_1a0,srcBuffer,sVar12);
        pZVar6 = local_110;
        if (0xffffffffffffff88 < sVar11) {
          return 0xffffffffffffffec;
        }
        local_1a8 = (BYTE *)dst;
        ZSTD_initFseState(&local_178,&local_1a0,local_110->LLTptr);
        ZSTD_initFseState(&local_168,&local_1a0,pZVar6->OFTptr);
        ZSTD_initFseState(&local_158,&local_1a0,pZVar6->MLTptr);
        ppBVar31 = &sequences[0].match;
        local_d4 = iVar19;
        for (uVar23 = 0;
            (BVar7 = BIT_reloadDStream(&local_1a0), pBVar30 = local_148[1],
            BVar7 != BIT_DStream_overflow && ((long)uVar23 < (long)iVar19)); uVar23 = uVar23 + 1) {
          bVar16 = local_178.table[local_178.state].nbAdditionalBits;
          bVar1 = local_158.table[local_158.state].nbAdditionalBits;
          bVar2 = local_168.table[local_168.state].nbAdditionalBits;
          uVar9 = local_178.table[local_178.state].baseValue;
          uVar10 = local_158.table[local_158.state].baseValue;
          uVar26 = (uint)bVar2;
          if (bVar2 == 0) {
            pBVar25 = (BYTE *)0x0;
LAB_0014b81d:
            pBVar30 = pBVar25 + ((ulong)uVar9 == 0);
            if (pBVar30 != (BYTE *)0x0) {
              if (pBVar30 == (BYTE *)0x3) {
                pBVar25 = local_148[0] + ((ulong)(local_148[0] == (BYTE *)0x1) - 1);
LAB_0014b866:
                local_148[2] = local_148[1];
              }
              else {
                pBVar25 = local_148[(long)pBVar30] + (local_148[(long)pBVar30] == (BYTE *)0x0);
                if (pBVar30 != (BYTE *)0x1) goto LAB_0014b866;
              }
              local_148[1] = local_148[0];
              goto LAB_0014b886;
            }
          }
          else {
            pBVar25 = (BYTE *)(((local_1a0.bitContainer << ((byte)local_1a0.bitsConsumed & 0x3f)) >>
                               (-bVar2 & 0x3f)) + (ulong)local_168.table[local_168.state].baseValue)
            ;
            local_1a0.bitsConsumed = local_1a0.bitsConsumed + uVar26;
            if (uVar26 == 1) goto LAB_0014b81d;
            local_148[1] = local_148[0];
            local_148[2] = pBVar30;
LAB_0014b886:
            local_148[1] = local_148[0];
            local_148[0] = pBVar25;
          }
          pBVar30 = local_148[0];
          if (bVar1 == 0) {
            uVar20 = 0;
          }
          else {
            uVar20 = (local_1a0.bitContainer << ((byte)local_1a0.bitsConsumed & 0x3f)) >>
                     (-bVar1 & 0x3f);
            local_1a0.bitsConsumed = local_1a0.bitsConsumed + bVar1;
          }
          if (0x1e < (uint)bVar1 + (uint)bVar16 + uVar26) {
            BIT_reloadDStream(&local_1a0);
          }
          if (bVar16 == 0) {
            uVar28 = 0;
          }
          else {
            uVar28 = (local_1a0.bitContainer << ((byte)local_1a0.bitsConsumed & 0x3f)) >>
                     (-bVar16 & 0x3f);
            local_1a0.bitsConsumed = local_1a0.bitsConsumed + bVar16;
          }
          sVar12 = uVar20 + uVar10;
          sVar11 = uVar28 + uVar9;
          pBVar14 = local_148[5] + sVar11;
          pBVar25 = local_148[(ulong)(pBVar14 < pBVar30) + 3];
          local_148[5] = pBVar14 + sVar12;
          pZVar5 = local_178.table + local_178.state;
          local_178.state =
               (((local_1a0.bitContainer << ((byte)local_1a0.bitsConsumed & 0x3f)) >> 1) >>
               (0x3f - pZVar5->nbBits & 0x3f)) + (ulong)local_178.table[local_178.state].nextState;
          iVar8 = local_1a0.bitsConsumed + pZVar5->nbBits;
          pZVar5 = local_158.table + local_158.state;
          local_158.state =
               (((local_1a0.bitContainer << ((byte)iVar8 & 0x3f)) >> 1) >>
               (0x3f - pZVar5->nbBits & 0x3f)) + (ulong)local_158.table[local_158.state].nextState;
          iVar8 = iVar8 + (uint)pZVar5->nbBits;
          pZVar5 = local_168.table + local_168.state;
          local_168.state =
               (((local_1a0.bitContainer << ((byte)iVar8 & 0x3f)) >> 1) >>
               (0x3f - pZVar5->nbBits & 0x3f)) + (ulong)local_168.table[local_168.state].nextState;
          local_1a0.bitsConsumed = iVar8 + (uint)pZVar5->nbBits;
          ((seq_t *)(ppBVar31 + -3))->litLength = sVar11;
          ppBVar31[-2] = (BYTE *)sVar12;
          ppBVar31[-1] = pBVar30;
          *ppBVar31 = pBVar14 + ((long)pBVar25 - (long)pBVar30);
          ppBVar31 = ppBVar31 + 4;
        }
        if ((long)uVar23 < (long)iVar19) {
          return 0xffffffffffffffec;
        }
        local_1b8 = pBVar32 + -8;
        local_d0 = pBVar32 + -0xd;
        local_1d8 = local_1a8;
        while( true ) {
          BVar7 = BIT_reloadDStream(&local_1a0);
          pBVar30 = local_148[1];
          uVar9 = (uint)uVar23;
          if ((BVar7 == BIT_DStream_overflow) || (nbSeq <= (int)uVar9)) break;
          bVar16 = local_178.table[local_178.state].nbAdditionalBits;
          bVar1 = local_158.table[local_158.state].nbAdditionalBits;
          bVar2 = local_168.table[local_168.state].nbAdditionalBits;
          uVar10 = local_178.table[local_178.state].baseValue;
          uVar26 = local_158.table[local_158.state].baseValue;
          uVar27 = (uint)bVar2;
          if (bVar2 == 0) {
            pBVar25 = (BYTE *)0x0;
LAB_0014bb04:
            pBVar30 = pBVar25 + ((ulong)uVar10 == 0);
            if (pBVar30 != (BYTE *)0x0) {
              if (pBVar30 == (BYTE *)0x3) {
                pBVar25 = local_148[0] + ((ulong)(local_148[0] == (BYTE *)0x1) - 1);
LAB_0014bb4d:
                local_148[2] = local_148[1];
              }
              else {
                pBVar25 = local_148[(long)pBVar30] + (local_148[(long)pBVar30] == (BYTE *)0x0);
                if (pBVar30 != (BYTE *)0x1) goto LAB_0014bb4d;
              }
              local_148[1] = local_148[0];
              goto LAB_0014bb6d;
            }
          }
          else {
            pBVar25 = (BYTE *)(((local_1a0.bitContainer << ((byte)local_1a0.bitsConsumed & 0x3f)) >>
                               (-bVar2 & 0x3f)) + (ulong)local_168.table[local_168.state].baseValue)
            ;
            local_1a0.bitsConsumed = local_1a0.bitsConsumed + uVar27;
            if (uVar27 == 1) goto LAB_0014bb04;
            local_148[1] = local_148[0];
            local_148[2] = pBVar30;
LAB_0014bb6d:
            local_148[1] = local_148[0];
            local_148[0] = pBVar25;
          }
          pBVar30 = local_148[0];
          if (bVar1 == 0) {
            uVar23 = 0;
          }
          else {
            uVar23 = (local_1a0.bitContainer << ((byte)local_1a0.bitsConsumed & 0x3f)) >>
                     (-bVar1 & 0x3f);
            local_1a0.bitsConsumed = local_1a0.bitsConsumed + bVar1;
          }
          if (0x1e < (uint)bVar1 + (uint)bVar16 + uVar27) {
            BIT_reloadDStream(&local_1a0);
          }
          if (bVar16 == 0) {
            uVar20 = 0;
          }
          else {
            uVar20 = (local_1a0.bitContainer << ((byte)local_1a0.bitsConsumed & 0x3f)) >>
                     (-bVar16 & 0x3f);
            local_1a0.bitsConsumed = local_1a0.bitsConsumed + bVar16;
          }
          lVar13 = uVar23 + uVar26;
          local_e8 = (BYTE *)(uVar20 + uVar10);
          pBVar18 = local_148[5] + (long)local_e8;
          pBVar14 = local_148[(ulong)(pBVar18 < pBVar30) + 3];
          local_148[5] = pBVar18 + lVar13;
          pZVar5 = local_178.table + local_178.state;
          local_178.state =
               (((local_1a0.bitContainer << ((byte)local_1a0.bitsConsumed & 0x3f)) >> 1) >>
               (0x3f - pZVar5->nbBits & 0x3f)) + (ulong)local_178.table[local_178.state].nextState;
          iVar19 = local_1a0.bitsConsumed + pZVar5->nbBits;
          pZVar5 = local_158.table + local_158.state;
          local_158.state =
               (((local_1a0.bitContainer << ((byte)iVar19 & 0x3f)) >> 1) >>
               (0x3f - pZVar5->nbBits & 0x3f)) + (ulong)local_158.table[local_158.state].nextState;
          iVar19 = iVar19 + (uint)pZVar5->nbBits;
          pZVar5 = local_168.table + local_168.state;
          local_168.state =
               (((local_1a0.bitContainer << ((byte)iVar19 & 0x3f)) >> 1) >>
               (0x3f - pZVar5->nbBits & 0x3f)) + (ulong)local_168.table[local_168.state].nextState;
          local_1a0.bitsConsumed = iVar19 + (uint)pZVar5->nbBits;
          uVar20 = (ulong)((uVar9 & 3) << 5);
          uVar23 = *(ulong *)((long)&sequences[0].litLength + uVar20);
          sVar24 = *(size_t *)((long)&sequences[0].matchLength + uVar20);
          pBVar25 = local_1d8 + (long)(uVar23 + sVar24);
          if (pBVar32 < pBVar25) {
            return 0xffffffffffffffba;
          }
          pBVar17 = litPtr + uVar23;
          if (local_1b0 < pBVar17) {
            return 0xffffffffffffffec;
          }
          local_148[6] = (BYTE *)(uVar23 + sVar24);
          local_f0 = (long *)((long)&sequences[0].litLength + uVar20);
          pBVar29 = local_1d8 + uVar23;
          if (local_1b8 < pBVar29) {
            sequence_00.matchLength = *(undefined8 *)((long)&sequences[0].matchLength + uVar20);
            sequence_00.litLength = *local_f0;
            sequence_00.offset = *(undefined8 *)((long)&sequences[0].offset + uVar20);
            sequence_00.match = *(BYTE **)((long)&sequences[0].match + uVar20);
            pBVar15 = (BYTE *)ZSTD_execSequenceLast7
                                        (local_1d8,pBVar32,sequence_00,&litPtr,local_1b0,local_1c0,
                                         local_f8,local_100);
          }
          else {
            local_c8 = *(ulong *)((long)&sequences[0].offset + uVar20);
            pBVar21 = *(BYTE **)((long)&sequences[0].match + uVar20);
            *(undefined8 *)local_1d8 = *(undefined8 *)litPtr;
            if (8 < uVar23) {
              pBVar15 = local_1d8 + 8;
              do {
                litPtr = litPtr + 8;
                *(undefined8 *)pBVar15 = *(undefined8 *)litPtr;
                pBVar15 = pBVar15 + 8;
              } while (pBVar15 < pBVar29);
            }
            litPtr = pBVar17;
            if ((ulong)((long)pBVar29 - (long)local_1c0) < local_c8) {
              if ((ulong)((long)pBVar29 - (long)local_f8) < local_c8) {
                return 0xffffffffffffffec;
              }
              local_e0 = pBVar30;
              if (local_100 < pBVar21 + sVar24) {
                local_c0 = (long)local_100 - (long)pBVar21;
                memmove(pBVar29,pBVar21,local_c0);
                pBVar29 = pBVar29 + local_c0;
                sVar24 = sVar24 - local_c0;
                pBVar30 = local_e0;
                if ((pBVar29 <= local_1b8) && (pBVar21 = local_1c0, 2 < sVar24)) goto LAB_0014be9f;
                for (uVar10 = 0; uVar23 = (ulong)uVar10, pBVar15 = local_148[6], uVar23 < sVar24;
                    uVar10 = uVar10 + 1) {
                  pBVar29[uVar23] = local_1c0[uVar23];
                }
              }
              else {
                memmove(pBVar29,pBVar21,sVar24);
                pBVar15 = local_148[6];
                pBVar30 = local_e0;
              }
            }
            else {
LAB_0014be9f:
              if (local_c8 < 8) {
                iVar19 = *(int *)(ZSTD_execSequence_dec64table + local_c8 * 4);
                *pBVar29 = *pBVar21;
                pBVar29[1] = pBVar21[1];
                pBVar29[2] = pBVar21[2];
                pBVar29[3] = pBVar21[3];
                pBVar17 = pBVar21 + *(uint *)(ZSTD_execSequence_dec32table + local_c8 * 4);
                pBVar21 = pBVar21 + ((ulong)*(uint *)(ZSTD_execSequence_dec32table + local_c8 * 4) -
                                    (long)iVar19);
                *(undefined4 *)(pBVar29 + 4) = *(undefined4 *)pBVar17;
              }
              else {
                *(undefined8 *)pBVar29 = *(undefined8 *)pBVar21;
              }
              pBVar17 = pBVar29 + 8;
              pBVar21 = pBVar21 + 8;
              pBVar15 = local_148[6];
              if (local_d0 < pBVar25) {
                pBVar29 = pBVar17;
                pBVar22 = pBVar21;
                if (pBVar17 < local_1b8) {
                  do {
                    *(undefined8 *)pBVar29 = *(undefined8 *)pBVar22;
                    pBVar29 = pBVar29 + 8;
                    pBVar22 = pBVar22 + 8;
                  } while (pBVar29 < local_1b8);
                  pBVar21 = pBVar21 + ((long)local_1b8 - (long)pBVar17);
                  pBVar17 = local_1b8;
                }
                for (; pBVar17 < pBVar25; pBVar17 = pBVar17 + 1) {
                  BVar3 = *pBVar21;
                  pBVar21 = pBVar21 + 1;
                  *pBVar17 = BVar3;
                }
              }
              else {
                do {
                  *(undefined8 *)pBVar17 = *(undefined8 *)pBVar21;
                  pBVar17 = pBVar17 + 8;
                  pBVar21 = pBVar21 + 8;
                } while (pBVar17 < pBVar29 + sVar24);
              }
            }
          }
          if ((BYTE *)0xffffffffffffff88 < pBVar15) {
            return (size_t)pBVar15;
          }
          *local_f0 = (long)local_e8;
          local_f0[1] = lVar13;
          local_f0[2] = (long)pBVar30;
          local_f0[3] = (long)(pBVar18 + ((long)pBVar14 - (long)pBVar30));
          local_1d8 = local_1d8 + (long)pBVar15;
          uVar23 = (ulong)(uVar9 + 1);
        }
        if ((int)uVar9 < nbSeq) {
          return 0xffffffffffffffec;
        }
        dst = local_1d8;
        for (uVar9 = uVar9 - local_d4; (int)uVar9 < nbSeq; uVar9 = uVar9 + 1) {
          uVar28 = (ulong)((uVar9 & 3) << 5);
          uVar20 = *(ulong *)((long)&sequences[0].litLength + uVar28);
          sVar24 = *(size_t *)((long)&sequences[0].matchLength + uVar28);
          uVar23 = uVar20 + sVar24;
          pBVar30 = (BYTE *)((long)dst + uVar23);
          if (pBVar32 < pBVar30) {
            return 0xffffffffffffffba;
          }
          pBVar25 = litPtr + uVar20;
          if (local_1b0 < pBVar25) {
            return 0xffffffffffffffec;
          }
          pBVar14 = (BYTE *)((long)dst + uVar20);
          if (local_1b8 < pBVar14) {
            sequence_01.matchLength = *(undefined8 *)((long)&sequences[0].matchLength + uVar28);
            sequence_01.litLength = *(undefined8 *)((long)&sequences[0].litLength + uVar28);
            sequence_01.offset = *(undefined8 *)((long)&sequences[0].offset + uVar28);
            sequence_01.match = *(BYTE **)((long)&sequences[0].match + uVar28);
            uVar23 = ZSTD_execSequenceLast7
                               ((BYTE *)dst,pBVar32,sequence_01,&litPtr,local_1b0,local_1c0,local_f8
                                ,local_100);
          }
          else {
            uVar4 = *(ulong *)((long)&sequences[0].offset + uVar28);
            pBVar18 = *(BYTE **)((long)&sequences[0].match + uVar28);
            *(undefined8 *)dst = *(undefined8 *)litPtr;
            if (8 < uVar20) {
              pBVar17 = (BYTE *)((long)dst + 8);
              do {
                litPtr = litPtr + 8;
                *(undefined8 *)pBVar17 = *(undefined8 *)litPtr;
                pBVar17 = pBVar17 + 8;
              } while (pBVar17 < pBVar14);
            }
            litPtr = pBVar25;
            if ((ulong)((long)pBVar14 - (long)local_1c0) < uVar4) {
              if ((ulong)((long)pBVar14 - (long)local_f8) < uVar4) {
                return 0xffffffffffffffec;
              }
              if (local_100 < pBVar18 + sVar24) {
                __n = (long)local_100 - (long)pBVar18;
                memmove(pBVar14,pBVar18,__n);
                pBVar14 = pBVar14 + __n;
                sVar24 = sVar24 - __n;
                if ((pBVar14 <= local_1b8) && (pBVar18 = local_1c0, 2 < sVar24)) goto LAB_0014c1c1;
                for (uVar10 = 0; uVar20 = (ulong)uVar10, uVar20 < sVar24; uVar10 = uVar10 + 1) {
                  pBVar14[uVar20] = local_1c0[uVar20];
                }
              }
              else {
                memmove(pBVar14,pBVar18,sVar24);
              }
            }
            else {
LAB_0014c1c1:
              if (uVar4 < 8) {
                iVar19 = *(int *)(ZSTD_execSequence_dec64table + uVar4 * 4);
                *pBVar14 = *pBVar18;
                pBVar14[1] = pBVar18[1];
                pBVar14[2] = pBVar18[2];
                pBVar14[3] = pBVar18[3];
                pBVar25 = pBVar18 + *(uint *)(ZSTD_execSequence_dec32table + uVar4 * 4);
                pBVar18 = pBVar18 + ((ulong)*(uint *)(ZSTD_execSequence_dec32table + uVar4 * 4) -
                                    (long)iVar19);
                *(undefined4 *)(pBVar14 + 4) = *(undefined4 *)pBVar25;
              }
              else {
                *(undefined8 *)pBVar14 = *(undefined8 *)pBVar18;
              }
              pBVar25 = pBVar14 + 8;
              pBVar18 = pBVar18 + 8;
              if (local_d0 < pBVar30) {
                pBVar14 = pBVar25;
                pBVar17 = pBVar18;
                if (pBVar25 < local_1b8) {
                  do {
                    *(undefined8 *)pBVar14 = *(undefined8 *)pBVar17;
                    pBVar14 = pBVar14 + 8;
                    pBVar17 = pBVar17 + 8;
                  } while (pBVar14 < local_1b8);
                  pBVar18 = pBVar18 + ((long)local_1b8 - (long)pBVar25);
                  pBVar25 = local_1b8;
                }
                for (; pBVar25 < pBVar30; pBVar25 = pBVar25 + 1) {
                  BVar3 = *pBVar18;
                  pBVar18 = pBVar18 + 1;
                  *pBVar25 = BVar3;
                }
              }
              else {
                do {
                  *(undefined8 *)pBVar25 = *(undefined8 *)pBVar18;
                  pBVar25 = pBVar25 + 8;
                  pBVar18 = pBVar18 + 8;
                } while (pBVar25 < pBVar14 + sVar24);
              }
            }
          }
          if (0xffffffffffffff88 < uVar23) {
            return uVar23;
          }
          dst = (void *)((long)dst + uVar23);
        }
        for (lVar13 = 0; pBVar25 = local_1b0, pBVar30 = local_1a8, lVar13 != 3; lVar13 = lVar13 + 1)
        {
          (local_110->entropy).rep[lVar13] = *(U32 *)(local_148 + lVar13);
        }
      }
      sVar24 = (long)pBVar25 - (long)litPtr;
      if ((ulong)((long)pBVar32 - (long)dst) < sVar24) {
        return 0xffffffffffffffba;
      }
      goto LAB_0014c33f;
    }
  }
  if (local_110->bmi2 != 0) {
    sVar11 = ZSTD_decompressSequences_bmi2
                       (local_110,dst,dstCapacity,srcBuffer,sVar12,nbSeq,in_stack_fffffffffffffde8);
    return sVar11;
  }
  pBVar32 = (BYTE *)(dstCapacity + (long)dst);
  litPtr = local_110->litPtr;
  sVar11 = local_110->litSize;
  pBVar25 = litPtr + sVar11;
  if (nbSeq != 0) {
    pBVar25 = (BYTE *)local_110->base;
    local_f0 = (long *)local_110->vBase;
    local_1c0 = (BYTE *)local_110->dictEnd;
    local_110->fseEntropy = 1;
    for (lVar13 = -6; lVar13 != 0; lVar13 = lVar13 + 2) {
      *(ulong *)((long)local_148 + lVar13 * 4 + 0x18) =
           (ulong)*(uint *)((long)&local_110->previousDstEnd + lVar13 * 2);
    }
    local_e8 = litPtr + sVar11;
    sVar11 = BIT_initDStream(&local_1a0,srcBuffer,sVar12);
    pZVar6 = local_110;
    if (0xffffffffffffff88 < sVar11) {
      return 0xffffffffffffffec;
    }
    ZSTD_initFseState(&local_178,&local_1a0,local_110->LLTptr);
    ZSTD_initFseState(&local_168,&local_1a0,pZVar6->OFTptr);
    ZSTD_initFseState(&local_158,&local_1a0,pZVar6->MLTptr);
    local_1b8 = pBVar32 + -8;
    local_148[6] = pBVar32 + -0xd;
    iVar19 = nbSeq;
    local_1a8 = (BYTE *)dst;
    while( true ) {
      pBVar30 = local_1a8;
      BVar7 = BIT_reloadDStream(&local_1a0);
      if ((BVar7 == BIT_DStream_overflow) || (iVar19 == 0)) break;
      bVar16 = local_178.table[local_178.state].nbAdditionalBits;
      bVar1 = local_158.table[local_158.state].nbAdditionalBits;
      bVar2 = local_168.table[local_168.state].nbAdditionalBits;
      uVar9 = local_178.table[local_178.state].baseValue;
      uVar10 = local_158.table[local_158.state].baseValue;
      uVar26 = (uint)bVar2;
      if (bVar2 == 0) {
        pBVar30 = (BYTE *)0x0;
LAB_0014b219:
        pBVar14 = pBVar30 + ((ulong)uVar9 == 0);
        if (pBVar14 != (BYTE *)0x0) {
          if (pBVar14 == (BYTE *)0x3) {
            pBVar30 = local_148[0] + ((ulong)(local_148[0] == (BYTE *)0x1) - 1);
          }
          else {
            pBVar30 = local_148[(long)pBVar14] + (local_148[(long)pBVar14] == (BYTE *)0x0);
            if (pBVar14 == (BYTE *)0x1) goto LAB_0014b282;
          }
          local_148[2] = local_148[1];
          goto LAB_0014b282;
        }
      }
      else {
        pBVar30 = (BYTE *)(((local_1a0.bitContainer << ((byte)local_1a0.bitsConsumed & 0x3f)) >>
                           (-bVar2 & 0x3f)) + (ulong)local_168.table[local_168.state].baseValue);
        local_1a0.bitsConsumed = local_1a0.bitsConsumed + uVar26;
        if (uVar26 == 1) goto LAB_0014b219;
        local_148[2] = local_148[1];
LAB_0014b282:
        local_148[1] = local_148[0];
        local_148[0] = pBVar30;
      }
      pBVar30 = local_148[0];
      if (bVar1 == 0) {
        uVar23 = 0;
      }
      else {
        uVar23 = (local_1a0.bitContainer << ((byte)local_1a0.bitsConsumed & 0x3f)) >>
                 (-bVar1 & 0x3f);
        local_1a0.bitsConsumed = local_1a0.bitsConsumed + bVar1;
      }
      if (0x1e < (uint)bVar1 + (uint)bVar16 + uVar26) {
        BIT_reloadDStream(&local_1a0);
      }
      if (bVar16 == 0) {
        uVar20 = 0;
      }
      else {
        uVar20 = (local_1a0.bitContainer << ((byte)local_1a0.bitsConsumed & 0x3f)) >>
                 (-bVar16 & 0x3f);
        local_1a0.bitsConsumed = local_1a0.bitsConsumed + bVar16;
      }
      sVar24 = uVar23 + uVar10;
      pZVar5 = local_178.table + local_178.state;
      local_178.state =
           (((local_1a0.bitContainer << ((byte)local_1a0.bitsConsumed & 0x3f)) >> 1) >>
           (0x3f - pZVar5->nbBits & 0x3f)) + (ulong)local_178.table[local_178.state].nextState;
      iVar8 = local_1a0.bitsConsumed + pZVar5->nbBits;
      pZVar5 = local_158.table + local_158.state;
      local_158.state =
           (((local_1a0.bitContainer << ((byte)iVar8 & 0x3f)) >> 1) >>
           (0x3f - pZVar5->nbBits & 0x3f)) + (ulong)local_158.table[local_158.state].nextState;
      iVar8 = iVar8 + (uint)pZVar5->nbBits;
      pZVar5 = local_168.table + local_168.state;
      sequences[0].litLength = uVar20 + uVar9;
      local_168.state =
           (((local_1a0.bitContainer << ((byte)iVar8 & 0x3f)) >> 1) >>
           (0x3f - pZVar5->nbBits & 0x3f)) + (ulong)local_168.table[local_168.state].nextState;
      local_1a0.bitsConsumed = iVar8 + (uint)pZVar5->nbBits;
      pBVar14 = (BYTE *)(sequences[0].litLength + sVar24);
      pBVar18 = (BYTE *)((long)dst + (long)pBVar14);
      if (pBVar32 < pBVar18) {
        return 0xffffffffffffffba;
      }
      pBVar17 = litPtr + sequences[0].litLength;
      if (local_e8 < pBVar17) {
        return 0xffffffffffffffec;
      }
      pBVar29 = (BYTE *)((long)dst + sequences[0].litLength);
      sequences[0].matchLength = sVar24;
      sequences[0].offset = (size_t)pBVar30;
      if (local_1b8 < pBVar29) {
        sequence.matchLength = sVar24;
        sequence.litLength = sequences[0].litLength;
        sequence.offset = (size_t)pBVar30;
        sequence.match = sequences[0].match;
        pBVar14 = (BYTE *)ZSTD_execSequenceLast7
                                    ((BYTE *)dst,pBVar32,sequence,&litPtr,local_e8,pBVar25,
                                     (BYTE *)local_f0,local_1c0);
      }
      else {
        *(undefined8 *)dst = *(undefined8 *)litPtr;
        if (8 < sequences[0].litLength) {
          pBVar21 = (BYTE *)((long)dst + 8);
          do {
            litPtr = litPtr + 8;
            *(undefined8 *)pBVar21 = *(undefined8 *)litPtr;
            pBVar21 = pBVar21 + 8;
          } while (pBVar21 < pBVar29);
        }
        pBVar21 = pBVar29 + -(long)pBVar30;
        litPtr = pBVar17;
        if (pBVar29 + -(long)pBVar25 < pBVar30) {
          if (pBVar29 + -(long)local_f0 < pBVar30) {
            return 0xffffffffffffffec;
          }
          lVar13 = (long)(pBVar29 + -(long)pBVar30) - (long)pBVar25;
          pBVar17 = local_1c0 + lVar13;
          local_1b0 = pBVar14;
          if (local_1c0 < pBVar17 + sVar24) {
            memmove(pBVar29,pBVar17,-lVar13);
            pBVar29 = pBVar29 + -lVar13;
            sequences[0].matchLength = sVar24 + lVar13;
            pBVar14 = local_1b0;
            if ((pBVar29 <= local_1b8) && (pBVar21 = pBVar25, 2 < sequences[0].matchLength))
            goto LAB_0014b515;
            for (uVar9 = 0; uVar23 = (ulong)uVar9, uVar23 < sequences[0].matchLength;
                uVar9 = uVar9 + 1) {
              pBVar29[uVar23] = pBVar25[uVar23];
            }
          }
          else {
            memmove(pBVar29,pBVar17,sVar24);
            pBVar14 = local_1b0;
          }
        }
        else {
LAB_0014b515:
          if (pBVar30 < (BYTE *)0x8) {
            iVar8 = *(int *)(ZSTD_execSequence_dec64table + (long)pBVar30 * 4);
            *pBVar29 = *pBVar21;
            pBVar29[1] = pBVar21[1];
            pBVar29[2] = pBVar21[2];
            pBVar29[3] = pBVar21[3];
            pBVar30 = pBVar21 + *(uint *)(ZSTD_execSequence_dec32table + sequences[0].offset * 4);
            pBVar21 = pBVar21 + ((ulong)*(uint *)(ZSTD_execSequence_dec32table +
                                                 sequences[0].offset * 4) - (long)iVar8);
            *(undefined4 *)(pBVar29 + 4) = *(undefined4 *)pBVar30;
          }
          else {
            *(undefined8 *)pBVar29 = *(undefined8 *)pBVar21;
          }
          pBVar30 = pBVar29 + 8;
          pBVar21 = pBVar21 + 8;
          if (local_148[6] < pBVar18) {
            pBVar17 = pBVar30;
            pBVar29 = pBVar21;
            if (pBVar30 < local_1b8) {
              do {
                *(undefined8 *)pBVar17 = *(undefined8 *)pBVar29;
                pBVar17 = pBVar17 + 8;
                pBVar29 = pBVar29 + 8;
              } while (pBVar17 < local_1b8);
              pBVar21 = pBVar21 + ((long)local_1b8 - (long)pBVar30);
              pBVar30 = local_1b8;
            }
            for (; pBVar30 < pBVar18; pBVar30 = pBVar30 + 1) {
              BVar3 = *pBVar21;
              pBVar21 = pBVar21 + 1;
              *pBVar30 = BVar3;
            }
          }
          else {
            do {
              *(undefined8 *)pBVar30 = *(undefined8 *)pBVar21;
              pBVar30 = pBVar30 + 8;
              pBVar21 = pBVar21 + 8;
            } while (pBVar30 < pBVar29 + sequences[0].matchLength);
          }
        }
      }
      dst = (void *)((long)dst + (long)pBVar14);
      iVar19 = iVar19 + -1;
      if ((BYTE *)0xffffffffffffff88 < pBVar14) {
        return (size_t)pBVar14;
      }
    }
    if (iVar19 != 0) {
      return 0xffffffffffffffec;
    }
    for (lVar13 = 0; pBVar25 = local_e8, lVar13 != 3; lVar13 = lVar13 + 1) {
      (local_110->entropy).rep[lVar13] = *(U32 *)(local_148 + lVar13);
    }
  }
  sVar24 = (long)pBVar25 - (long)litPtr;
  if ((ulong)((long)pBVar32 - (long)dst) < sVar24) {
    return 0xffffffffffffffba;
  }
LAB_0014c33f:
  memcpy(dst,litPtr,sVar24);
  return (size_t)(BYTE *)((long)dst + (sVar24 - (long)pBVar30));
}

Assistant:

static size_t ZSTD_decompressBlock_internal(ZSTD_DCtx* dctx,
                            void* dst, size_t dstCapacity,
                      const void* src, size_t srcSize, const int frame)
{   /* blockType == blockCompressed */
    const BYTE* ip = (const BYTE*)src;
    /* isLongOffset must be true if there are long offsets.
     * Offsets are long if they are larger than 2^STREAM_ACCUMULATOR_MIN.
     * We don't expect that to be the case in 64-bit mode.
     * In block mode, window size is not known, so we have to be conservative. (note: but it could be evaluated from current-lowLimit)
     */
    ZSTD_longOffset_e const isLongOffset = (ZSTD_longOffset_e)(MEM_32bits() && (!frame || dctx->fParams.windowSize > (1ULL << STREAM_ACCUMULATOR_MIN)));
    DEBUGLOG(5, "ZSTD_decompressBlock_internal (size : %u)", (U32)srcSize);

    if (srcSize >= ZSTD_BLOCKSIZE_MAX) return ERROR(srcSize_wrong);

    /* Decode literals section */
    {   size_t const litCSize = ZSTD_decodeLiteralsBlock(dctx, src, srcSize);
        DEBUGLOG(5, "ZSTD_decodeLiteralsBlock : %u", (U32)litCSize);
        if (ZSTD_isError(litCSize)) return litCSize;
        ip += litCSize;
        srcSize -= litCSize;
    }

    /* Build Decoding Tables */
    {   int nbSeq;
        size_t const seqHSize = ZSTD_decodeSeqHeaders(dctx, &nbSeq, ip, srcSize);
        if (ZSTD_isError(seqHSize)) return seqHSize;
        ip += seqHSize;
        srcSize -= seqHSize;

        if ( (!frame || dctx->fParams.windowSize > (1<<24))
          && (nbSeq>0) ) {  /* could probably use a larger nbSeq limit */
            U32 const shareLongOffsets = ZSTD_getLongOffsetsShare(dctx->OFTptr);
            U32 const minShare = MEM_64bits() ? 7 : 20; /* heuristic values, correspond to 2.73% and 7.81% */
            if (shareLongOffsets >= minShare)
                return ZSTD_decompressSequencesLong(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset);
        }

        return ZSTD_decompressSequences(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset);
    }
}